

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::InsertIncludes
          (ConversionStream *this,String *GLSLSource,
          IShaderSourceInputStreamFactory *pSourceStreamFactory)

{
  char cVar1;
  char cVar2;
  size_type sVar3;
  pointer pcVar4;
  uint *puVar5;
  long lVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  char *pcVar10;
  void *pvVar11;
  char *pcVar12;
  char *pcVar13;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar18;
  RefCntAutoPtr<Diligent::IFileStream> pIncludeDataStream;
  RefCntAutoPtr<Diligent::DataBlobImpl> pIncludeData;
  String IncludeName;
  String IncludeFileLowercase;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ProcessedIncludes;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  long *local_f0;
  DataBlobImpl *local_e8;
  undefined1 *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  uint *local_b8;
  long local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  uint *local_98;
  long local_90;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  IShaderSourceInputStreamFactory *local_78;
  char *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_78 = pSourceStreamFactory;
  do {
    local_f8._M_current = (GLSLSource->_M_dataplus)._M_p;
    sVar3 = GLSLSource->_M_string_length;
    _Var14._M_current = local_f8._M_current + sVar3;
    _Var9._M_current = local_f8._M_current;
    if (sVar3 != 0) {
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_f8._M_current + sVar3);
      do {
        local_d8._M_dataplus._M_p = (pointer)paVar8;
        _Var9 = Parsing::
                SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                          (&local_f8,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_d8,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((GLSLSource->_M_dataplus)._M_p + GLSLSource->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_current == paVar8) break;
        if (*_Var9._M_current == '#') {
          local_f8._M_current = _Var9._M_current + 1;
          local_d8._M_dataplus._M_p = (pointer)paVar8;
          local_f8 = Parsing::
                     SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                               (&local_f8,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_d8,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
          pcVar12 = (GLSLSource->_M_dataplus)._M_p + GLSLSource->_M_string_length;
          _Var14 = _Var9;
          _Var9 = local_f8;
          if (local_f8._M_current == pcVar12) break;
          if ((pcVar12 != local_f8._M_current) && (*local_f8._M_current == 'i')) {
            pcVar13 = "nclude";
            pcVar10 = local_f8._M_current + 1;
            pcVar16 = local_f8._M_current + 1;
            do {
              _Var9._M_current = pcVar16;
              cVar1 = *pcVar13;
              if ((cVar1 == '\0') || (pcVar10 == pcVar12)) break;
              pcVar13 = pcVar13 + 1;
              cVar2 = *pcVar10;
              pcVar10 = pcVar10 + 1;
              pcVar16 = _Var9._M_current + 1;
            } while (cVar1 == cVar2);
            if (cVar1 == '\0') break;
          }
        }
        else {
          local_f8._M_current = _Var9._M_current + 1;
        }
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((GLSLSource->_M_dataplus)._M_p + GLSLSource->_M_string_length);
        _Var9._M_current = local_f8._M_current;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_f8._M_current != paVar8);
    }
    local_f8._M_current = _Var9._M_current;
    pcVar12 = (GLSLSource->_M_dataplus)._M_p + GLSLSource->_M_string_length;
    if (local_f8._M_current == pcVar12) break;
    local_70 = local_f8._M_current;
    local_d8._M_dataplus._M_p = pcVar12;
    local_f8 = Parsing::
               SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (&local_f8,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_d8,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
    if (local_f8._M_current == (GLSLSource->_M_dataplus)._M_p + GLSLSource->_M_string_length) {
      LogError<true,char[40]>
                (false,"InsertIncludes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x2f9,(char (*) [40])"Unexpected EOF after #include directive");
    }
    if ((*local_f8._M_current != '\"') && (*local_f8._M_current != '<')) {
      LogError<true,char[52]>
                (false,"InsertIncludes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x2fd,(char (*) [52])"Missing open quotes or \'<\' after #include directive");
    }
    pcVar10 = (GLSLSource->_M_dataplus)._M_p + GLSLSource->_M_string_length;
    pcVar16 = local_f8._M_current + 1;
    for (local_f8._M_current = pcVar16;
        ((local_f8._M_current != pcVar10 && (*local_f8._M_current != '\"')) &&
        (*local_f8._M_current != '>')); local_f8._M_current = local_f8._M_current + 1) {
    }
    if (local_f8._M_current == pcVar10) {
      LogError<true,char[55]>
                (false,"InsertIncludes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x307,(char (*) [55])"Missing closing quotes or \'>\' after #include directive");
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_d8,pcVar16,local_f8._M_current);
    local_f8._M_current = local_f8._M_current + 1;
    pcVar4 = (GLSLSource->_M_dataplus)._M_p;
    uVar15 = (long)_Var14._M_current - (long)pcVar4;
    if (pcVar4 + GLSLSource->_M_string_length == local_f8._M_current) {
      GLSLSource->_M_string_length = uVar15;
      pcVar4[uVar15] = '\0';
    }
    else {
      std::__cxx11::string::_M_erase((ulong)GLSLSource,uVar15);
    }
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    lVar6 = local_b0;
    puVar5 = local_b8;
    if (local_b0 != 0) {
      lVar17 = 0;
      do {
        iVar7 = tolower((uint)*(byte *)((long)puVar5 + lVar17));
        *(char *)((long)puVar5 + lVar17) = (char)iVar7;
        lVar17 = lVar17 + 1;
      } while (lVar6 != lVar17);
    }
    if (local_b8 == &local_a8) {
      uStack_80 = uStack_a0;
      uStack_7c = uStack_9c;
      local_98 = (uint *)&local_88;
    }
    else {
      local_98 = local_b8;
    }
    local_88 = CONCAT44(uStack_a4,local_a8);
    local_90 = local_b0;
    local_b0 = 0;
    local_a8 = local_a8 & 0xffffff00;
    local_e8 = (DataBlobImpl *)&local_68;
    local_b8 = &local_a8;
    pVar18 = std::
             _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             ::
             _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                       ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         *)local_e8,&local_98,&local_e8);
    if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_f0 = (long *)0x0;
      local_e8 = (DataBlobImpl *)0x0;
      local_e0 = (undefined1 *)&local_f0;
      (*(local_78->super_IObject)._vptr_IObject[4])(local_78,local_d8._M_dataplus._M_p,&local_e8);
      RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
                ((DoublePtrHelper<Diligent::IFileStream> *)&local_e8);
      if (local_f0 == (long *)0x0) {
        LogError<true,char[29],std::__cxx11::string>
                  (false,"InsertIncludes",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x31c,(char (*) [29])"Failed to open include file ",&local_d8);
      }
      DataBlobImpl::Create((DataBlobImpl *)&local_e8,0,(void *)0x0);
      (**(code **)(*local_f0 + 0x28))();
      pvVar11 = DataBlobImpl::GetConstDataPtr(local_e8,0);
      DataBlobImpl::GetSize(local_e8);
      std::__cxx11::string::replace
                ((ulong)GLSLSource,(long)_Var14._M_current - (long)(GLSLSource->_M_dataplus)._M_p,
                 (char *)0x0,(ulong)pvVar11);
      RefCntAutoPtr<Diligent::DataBlobImpl>::Release
                ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&local_e8);
      if (local_f0 != (long *)0x0) {
        (**(code **)(*local_f0 + 0x10))();
        local_f0 = (long *)0x0;
      }
    }
    if (local_98 != (uint *)&local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  } while (local_70 != pcVar12);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::InsertIncludes(String& GLSLSource, IShaderSourceInputStreamFactory* pSourceStreamFactory)
{
    // Put all the includes into the set to avoid multiple inclusion
    std::unordered_set<String> ProcessedIncludes;

    try
    {
        do
        {
            // Find the first #include statement
            auto Pos             = GLSLSource.begin();
            auto IncludeStartPos = GLSLSource.end();
            while (Pos != GLSLSource.end())
            {
                // #   include "TestFile.fxh"
                Pos = SkipDelimitersAndComments(Pos, GLSLSource.end());
                if (Pos == GLSLSource.end())
                    break;
                if (*Pos == '#')
                {
                    IncludeStartPos = Pos;
                    // #   include "TestFile.fxh"
                    // ^
                    ++Pos;
                    // #   include "TestFile.fxh"
                    //  ^
                    Pos = SkipDelimitersAndComments(Pos, GLSLSource.end());
                    if (Pos == GLSLSource.end())
                    {
                        // End of the file reached - break
                        break;
                    }
                    // #   include "TestFile.fxh"
                    //     ^
                    if (Parsing::SkipString(Pos, GLSLSource.end(), "include", Pos))
                    {
                        // #   include "TestFile.fxh"
                        //            ^
                        break;
                    }
                    else
                    {
                        // This is not an #include directive:
                        // #define MACRO
                        // Continue search through the file
                    }
                }
                else
                    ++Pos;
            }

            // No more #include found
            if (Pos == GLSLSource.end())
                break;

            // Find open quotes
            Pos = SkipDelimitersAndComments(Pos, GLSLSource.end());
            if (Pos == GLSLSource.end())
                LOG_ERROR_AND_THROW("Unexpected EOF after #include directive");
            // #   include "TestFile.fxh"
            //             ^
            if (*Pos != '\"' && *Pos != '<')
                LOG_ERROR_AND_THROW("Missing open quotes or \'<\' after #include directive");
            ++Pos;
            // #   include "TestFile.fxh"
            //              ^
            auto IncludeNameStartPos = Pos;
            // Find closing quotes
            while (Pos != GLSLSource.end() && *Pos != '\"' && *Pos != '>') ++Pos;
            // #   include "TestFile.fxh"
            //                          ^
            if (Pos == GLSLSource.end())
                LOG_ERROR_AND_THROW("Missing closing quotes or \'>\' after #include directive");

            // Get the name of the include file
            auto IncludeName = String(IncludeNameStartPos, Pos);
            ++Pos;
            // #   include "TestFile.fxh"
            // ^                         ^
            // IncludeStartPos           Pos
            GLSLSource.erase(IncludeStartPos, Pos);

            // Convert the name to lower case
            String IncludeFileLowercase = StrToLower(IncludeName);
            // Insert the lower-case name into the set
            auto It = ProcessedIncludes.insert(IncludeFileLowercase);
            // If the name was actually inserted, which means the include encountered for the first time,
            // replace the text with the file content
            if (It.second)
            {
                RefCntAutoPtr<IFileStream> pIncludeDataStream;
                pSourceStreamFactory->CreateInputStream(IncludeName.c_str(), &pIncludeDataStream);
                if (!pIncludeDataStream)
                    LOG_ERROR_AND_THROW("Failed to open include file ", IncludeName);
                auto pIncludeData = DataBlobImpl::Create();
                pIncludeDataStream->ReadBlob(pIncludeData);

                // Get include text
                const Char* IncludeText = pIncludeData->GetConstDataPtr<Char>();
                size_t      NumSymbols  = pIncludeData->GetSize();

                // Insert the text into source
                GLSLSource.insert(IncludeStartPos - GLSLSource.begin(), IncludeText, NumSymbols);
            }
        } while (true);
    }
    catch (const std::pair<std::string::iterator, const char*>& ErrInfo)
    {
        LOG_ERROR_AND_THROW("Unable to process includes: ", ErrInfo.second);
    }
}